

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsTypes.cpp
# Opt level: O1

string * __thiscall
helics::helicsComplexString_abi_cxx11_
          (string *__return_storage_ptr__,helics *this,double real,double imag)

{
  size_t sVar1;
  char *pcVar2;
  char *this_00;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 in_R9;
  string_view fmt;
  format_args args;
  double local_28 [2];
  double local_18;
  
  if ((imag != 0.0) || (NAN(imag))) {
    this_00 = "[{},{}]";
    pcVar2 = (char *)0x7;
    sVar1 = 0xaa;
    local_18 = imag;
  }
  else {
    this_00 = "{}";
    pcVar2 = (char *)0x2;
    sVar1 = 10;
  }
  fmt.size_ = sVar1;
  fmt.data_ = pcVar2;
  args.field_1.args_ = in_R9.args_;
  args.desc_ = (unsigned_long_long)local_28;
  local_28[0] = real;
  ::fmt::v11::vformat_abi_cxx11_(__return_storage_ptr__,(v11 *)this_00,fmt,args);
  return __return_storage_ptr__;
}

Assistant:

std::string helicsComplexString(double real, double imag)
{
    return (imag != 0.0) ? fmt::format(FMT_STRING("[{},{}]"), real, imag) :
                           fmt::format(FMT_STRING("{}"), real);
}